

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::FinishWriting(TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                *this)

{
  ostream *poVar1;
  long in_RDI;
  
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"FinishWriting");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  *(undefined4 *)(in_RDI + 0x2c0) = 1;
  std::condition_variable::notify_all();
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::FinishWriting(){
	// FinishWriting already has a lock
	cout << endl << "FinishWriting" << endl;
	cout.flush();     
	fFinish = 1;
	// FinishWriting already has a lock
    fwritecond.notify_all();
}